

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  undefined2 *puVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  short *psVar5;
  int iVar6;
  int iVar7;
  undefined2 *puVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  size_t local_58;
  
  uVar13 = tableLog - 5;
  uVar11 = maxSymbolValue + 1;
  puVar8 = (undefined2 *)header;
  if (uVar11 == 0) {
    bVar19 = false;
    lVar4 = 1;
    uVar16 = 0;
LAB_0010937c:
    local_58 = 0xffffffffffffffff;
    if (bVar19) {
      if (uVar11 < uVar16) {
        __assert_fail("symbol <= alphabetSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x164e,
                      "size_t FSE_writeNCount_generic(void *, size_t, const short *, unsigned int, unsigned int, unsigned int)"
                     );
      }
      if ((writeIsSafe != 0) ||
         (local_58 = 0xffffffffffffffba,
         puVar8 <= (undefined2 *)((long)header + (headerBufferSize - 2)))) {
        *puVar8 = (short)uVar13;
        local_58 = (long)puVar8 + (lVar4 - (long)header);
      }
    }
    return local_58;
  }
  iVar17 = 1 << ((byte)tableLog & 0x1f);
  puVar1 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar7 = 4;
  bVar19 = false;
  uVar16 = 0;
  iVar10 = tableLog + 1;
  uVar3 = iVar17 + 1;
LAB_0010919a:
  uVar15 = uVar16;
  if (bVar19) {
    if (uVar16 < uVar11) {
      psVar5 = normalizedCounter + uVar16;
      uVar12 = uVar16;
      do {
        uVar15 = uVar12;
        if (*psVar5 != 0) break;
        uVar12 = uVar12 + 1;
        psVar5 = psVar5 + 1;
        uVar15 = uVar11;
      } while (uVar11 != uVar12);
    }
    iVar9 = 3;
    if (uVar15 != uVar11) {
      if (uVar16 + 0x18 <= uVar15) {
        uVar12 = uVar16;
        do {
          uVar13 = uVar13 + (0xffff << ((byte)iVar7 & 0x1f));
          if ((writeIsSafe == 0) && (puVar1 < puVar8)) {
            local_58 = 0xffffffffffffffba;
            iVar9 = 1;
            goto LAB_00109296;
          }
          *puVar8 = (short)uVar13;
          puVar8 = puVar8 + 1;
          uVar13 = uVar13 >> 0x10;
          uVar16 = uVar12 + 0x18;
          uVar14 = uVar12 + 0x30;
          uVar12 = uVar16;
        } while (uVar14 <= uVar15);
      }
      uVar12 = uVar16 + 3;
      iVar6 = iVar7;
      while (uVar12 <= uVar15) {
        uVar13 = uVar13 + (3 << ((byte)iVar6 & 0x1f));
        iVar6 = iVar6 + 2;
        uVar12 = uVar16 + 6;
        uVar16 = uVar16 + 3;
      }
      uVar13 = (uVar15 - uVar16 << ((byte)iVar6 & 0x1f)) + uVar13;
      iVar7 = iVar6 + 2;
      iVar9 = 0;
      if (0xe < iVar6) {
        if ((writeIsSafe == 0) && (puVar1 < puVar8)) {
          local_58 = 0xffffffffffffffba;
          iVar9 = 1;
        }
        else {
          *puVar8 = (short)uVar13;
          puVar8 = puVar8 + 1;
          uVar13 = uVar13 >> 0x10;
          iVar7 = iVar6 + -0xe;
          iVar9 = 0;
        }
      }
    }
LAB_00109296:
    if (iVar9 != 0) {
      uVar16 = uVar15;
      uVar12 = uVar3;
      if (iVar9 != 3) {
        return local_58;
      }
LAB_00109365:
      bVar19 = uVar12 == 1;
      iVar17 = iVar7 + 0xe;
      if (-1 < iVar7 + 7) {
        iVar17 = iVar7 + 7;
      }
      lVar4 = (long)(iVar17 >> 3);
      goto LAB_0010937c;
    }
  }
  iVar6 = (int)normalizedCounter[uVar15];
  iVar9 = -iVar6;
  if (0 < iVar6) {
    iVar9 = iVar6;
  }
  iVar2 = ~uVar3 + iVar17 * 2;
  iVar18 = iVar2;
  if (iVar6 + 1 < iVar17) {
    iVar18 = 0;
  }
  iVar18 = iVar18 + iVar6 + 1;
  bVar19 = iVar18 == 1;
  uVar12 = uVar3 - iVar9;
  iVar6 = iVar10;
  if (uVar12 == 0 || (int)uVar3 < iVar9) {
    local_58 = 0xffffffffffffffff;
  }
  else {
    for (; (int)uVar12 < iVar17; iVar17 = iVar17 >> 1) {
      iVar6 = iVar6 + -1;
    }
  }
  if ((int)uVar12 < 1) {
    return local_58;
  }
  uVar13 = uVar13 + (iVar18 << ((byte)iVar7 & 0x1f));
  iVar7 = (iVar7 + iVar10) - (uint)(iVar18 < iVar2);
  if (0x10 < iVar7) {
    if ((writeIsSafe == 0) && (puVar1 < puVar8)) {
      return 0xffffffffffffffba;
    }
    *puVar8 = (short)uVar13;
    puVar8 = puVar8 + 1;
    uVar13 = uVar13 >> 0x10;
    iVar7 = iVar7 + -0x10;
  }
  uVar16 = uVar15 + 1;
  if ((uVar11 <= uVar16) || (iVar10 = iVar6, uVar3 = uVar12, uVar12 == 1)) goto LAB_00109365;
  goto LAB_0010919a;
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    return (out-ostart);
}